

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O0

bool __thiscall
mocker::detail::ReassociationImpl::areSameAddrs
          (ReassociationImpl *this,shared_ptr<mocker::ir::Addr> *lhs,
          shared_ptr<mocker::ir::Addr> *rhs)

{
  bool bVar1;
  element_type *peVar2;
  int64_t iVar3;
  int64_t iVar4;
  element_type *peVar5;
  string *__lhs;
  string *__rhs;
  bool local_7e;
  bool local_7d;
  undefined1 local_78 [8];
  shared_ptr<mocker::ir::IntLiteral> rhsLit;
  shared_ptr<mocker::ir::Reg> rhsReg;
  undefined1 local_48 [8];
  shared_ptr<mocker::ir::IntLiteral> lhsLit;
  shared_ptr<mocker::ir::Reg> lhsReg;
  shared_ptr<mocker::ir::Addr> *rhs_local;
  shared_ptr<mocker::ir::Addr> *lhs_local;
  ReassociationImpl *this_local;
  
  ir::dyc<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
            ((ir *)&lhsLit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,lhs);
  ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>((ir *)local_48,lhs);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &lhsLit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  local_7d = true;
  if (!bVar1) {
    local_7d = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
  }
  if (local_7d == false) {
    __assert_fail("lhsReg || lhsLit",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                  ,0x9a,
                  "bool mocker::detail::ReassociationImpl::areSameAddrs(const std::shared_ptr<ir::Addr> &, const std::shared_ptr<ir::Addr> &)"
                 );
  }
  ir::dyc<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
            ((ir *)&rhsLit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,rhs);
  ir::dyc<mocker::ir::IntLiteral,std::shared_ptr<mocker::ir::Addr>const&>((ir *)local_78,rhs);
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     &rhsLit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  local_7e = true;
  if (!bVar1) {
    local_7e = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78);
  }
  if (local_7e != false) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
    if ((bVar1) &&
       (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_78), bVar1)) {
      peVar2 = std::
               __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      iVar3 = ir::IntLiteral::getVal(peVar2);
      peVar2 = std::
               __shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_78);
      iVar4 = ir::IntLiteral::getVal(peVar2);
      this_local._7_1_ = iVar3 == iVar4;
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &lhsLit.
                          super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if ((bVar1) &&
         (bVar1 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)
                             &rhsLit.
                              super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount), bVar1)) {
        peVar5 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&lhsLit.
                                  super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        __lhs = ir::Reg::getIdentifier_abi_cxx11_(peVar5);
        peVar5 = std::__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&rhsLit.
                                  super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount);
        __rhs = ir::Reg::getIdentifier_abi_cxx11_(peVar5);
        this_local._7_1_ = std::operator==(__lhs,__rhs);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
              ((shared_ptr<mocker::ir::IntLiteral> *)local_78);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr
              ((shared_ptr<mocker::ir::Reg> *)
               &rhsLit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr
              ((shared_ptr<mocker::ir::IntLiteral> *)local_48);
    std::shared_ptr<mocker::ir::Reg>::~shared_ptr
              ((shared_ptr<mocker::ir::Reg> *)
               &lhsLit.super___shared_ptr<mocker::ir::IntLiteral,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return this_local._7_1_;
  }
  __assert_fail("rhsReg || rhsLit",
                "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/optim/reassociation.cpp"
                ,0x9d,
                "bool mocker::detail::ReassociationImpl::areSameAddrs(const std::shared_ptr<ir::Addr> &, const std::shared_ptr<ir::Addr> &)"
               );
}

Assistant:

bool detail::ReassociationImpl::areSameAddrs(
    const std::shared_ptr<ir::Addr> &lhs,
    const std::shared_ptr<ir::Addr> &rhs) {
  auto lhsReg = ir::dyc<ir::Reg>(lhs);
  auto lhsLit = ir::dyc<ir::IntLiteral>(lhs);
  assert(lhsReg || lhsLit);
  auto rhsReg = ir::dyc<ir::Reg>(rhs);
  auto rhsLit = ir::dyc<ir::IntLiteral>(rhs);
  assert(rhsReg || rhsLit);
  if (lhsLit && rhsLit)
    return lhsLit->getVal() == rhsLit->getVal();
  if (lhsReg && rhsReg)
    return lhsReg->getIdentifier() == rhsReg->getIdentifier();
  return false;
}